

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall
presolve::HPresolve::substitute(HPresolve *this,HighsInt row,HighsInt col,double rhs)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  int col_00;
  pointer pdVar4;
  int *piVar5;
  pointer piVar6;
  uint *puVar7;
  HighsInt HVar8;
  HighsLp *pHVar9;
  int *piVar10;
  uint uVar11;
  uint *puVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  HighsCDouble HVar16;
  HighsCDouble objscale;
  HighsCDouble local_50;
  HighsCDouble local_40;
  
  HVar8 = findNonzero(this,row,col);
  dVar13 = -1.0 / (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[HVar8];
  markRowDeleted(this,row);
  (this->changedColFlag).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[col] = '\x01';
  (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[col] = '\x01';
  this->numDeletedCols = this->numDeletedCols + 1;
  uVar3 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  while (uVar11 = uVar3, uVar11 != 0xffffffff) {
    iVar2 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar11];
    uVar3 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar11];
    if (iVar2 != row) {
      dVar14 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[(int)uVar11] * dVar13;
      unlink(this,(char *)(ulong)uVar11);
      pHVar9 = this->model;
      pdVar4 = (pHVar9->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar1 = pdVar4[iVar2];
      dVar15 = dVar14 * rhs;
      if (-INFINITY < dVar1) {
        pdVar4[iVar2] = dVar1 + dVar15;
      }
      pdVar4 = (pHVar9->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar1 = pdVar4[iVar2];
      if (dVar1 < INFINITY) {
        pdVar4[iVar2] = dVar15 + dVar1;
      }
      piVar5 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar10 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start; piVar10 != piVar5; piVar10 = piVar10 + 1) {
        col_00 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[*piVar10];
        if (col_00 != col) {
          addToMatrix(this,iVar2,col_00,
                      (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[*piVar10] * dVar14);
        }
      }
      reinsertEquation(this,iVar2);
    }
  }
  dVar1 = (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    local_40.hi = dVar13 * dVar1;
    local_40.lo = 0.0;
    dVar13 = this->model->offset_;
    local_50 = HighsCDouble::operator*(&local_40,rhs);
    HVar16 = operator-(dVar13,&local_50);
    pHVar9 = this->model;
    pHVar9->offset_ = HVar16.lo + HVar16.hi;
    piVar5 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar10 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start; piVar10 != piVar5; piVar10 = piVar10 + 1) {
      iVar2 = *piVar10;
      dVar13 = (pHVar9->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start
               [(this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar2]];
      local_50 = HighsCDouble::operator*
                           (&local_40,
                            (this->Avalue).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar2]);
      HVar16 = HighsCDouble::operator+(&local_50,dVar13);
      pHVar9 = this->model;
      piVar6 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      (pHVar9->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[piVar6[iVar2]] = HVar16.lo + HVar16.hi;
      iVar2 = piVar6[iVar2];
      pdVar4 = (pHVar9->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (ABS(pdVar4[iVar2]) <= (this->options->super_HighsOptionsStruct).small_matrix_value) {
        pdVar4[iVar2] = 0.0;
      }
    }
    (pHVar9->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = 0.0;
  }
  puVar7 = (uint *)(this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  for (puVar12 = (uint *)(this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start; puVar12 != puVar7; puVar12 = puVar12 + 1)
  {
    unlink(this,(char *)(ulong)*puVar12);
  }
  return;
}

Assistant:

void HPresolve::substitute(HighsInt row, HighsInt col, double rhs) {
  assert(!rowDeleted[row]);
  assert(!colDeleted[col]);
  HighsInt pos = findNonzero(row, col);
  assert(pos != -1);

  assert(Arow[pos] == row);
  assert(Acol[pos] == col);
  double substrowscale = -1.0 / Avalue[pos];
  assert(isImpliedFree(col));

  markRowDeleted(row);
  markColDeleted(col);

  // substitute the column in each row where it occurs
  for (HighsInt coliter = colhead[col]; coliter != -1;) {
    HighsInt colrow = Arow[coliter];
    double colval = Avalue[coliter];

    // walk to the next position before doing any modifications, because
    // the current position will be deleted in the loop below
    assert(Acol[coliter] == col);
    HighsInt colpos = coliter;
    coliter = Anext[coliter];

    // skip the row that is used for substitution
    if (row == colrow) continue;

    assert(findNonzero(colrow, col) != -1);

    // cancels out and bounds of dual row for this column do not need to be
    // updated
    unlink(colpos);

    // printf("\nbefore substitution: ");
    // debugPrintRow(colrow);

    // determine the scale for the substitution row for addition to this row
    double scale = colval * substrowscale;

    // adjust the sides
    if (model->row_lower_[colrow] != -kHighsInf)
      model->row_lower_[colrow] += scale * rhs;

    if (model->row_upper_[colrow] != kHighsInf)
      model->row_upper_[colrow] += scale * rhs;

    for (HighsInt rowiter : rowpositions) {
      assert(Arow[rowiter] == row);

      if (Acol[rowiter] != col)
        addToMatrix(colrow, Acol[rowiter], scale * Avalue[rowiter]);
    }

    // check if this is an equation row and it now has a different size
    reinsertEquation(colrow);
    // printf("after substitution: ");
    // debugPrintRow(colrow);
  }

  assert(colsize[col] == 1);

  // substitute column in the objective function
  if (model->col_cost_[col] != 0.0) {
    HighsCDouble objscale = model->col_cost_[col] * substrowscale;
    model->offset_ = static_cast<double>(model->offset_ - objscale * rhs);
    assert(std::isfinite(model->offset_));
    for (HighsInt rowiter : rowpositions) {
      // printf("changing col cost to %g = %g + %g * %g\n",
      // double(model->col_cost_[Acol[rowiter]] + objscale * Avalue[rowiter]),
      // model->col_cost_[Acol[rowiter]], double(objscale), Avalue[rowiter]);
      model->col_cost_[Acol[rowiter]] = static_cast<double>(
          model->col_cost_[Acol[rowiter]] + objscale * Avalue[rowiter]);
      if (std::abs(model->col_cost_[Acol[rowiter]]) <=
          options->small_matrix_value)
        model->col_cost_[Acol[rowiter]] = 0.0;
    }
    assert(std::abs(model->col_cost_[col]) <=
           std::max(options->dual_feasibility_tolerance,
                    kHighsTiny * std::abs(static_cast<double>(objscale))));
    model->col_cost_[col] = 0.0;
  }

  // finally remove the entries of the row that was used for substitution
  for (HighsInt rowiter : rowpositions) unlink(rowiter);
}